

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_arith(lua_State *L,TValue *ra,cTValue *rb,cTValue *rc,BCReg op)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  TValue *o;
  MMS mm;
  double dVar6;
  TValue tempb;
  TValue tempc;
  TValue local_40;
  TValue local_38;
  
  uVar1 = lj_bc_mode[op];
  uVar3 = rb->it64 >> 0x2f;
  pTVar5 = rb;
  if (0xfffffffffffffff1 < uVar3) {
    if (uVar3 == 0xfffffffffffffffb) {
      pTVar5 = &local_40;
      iVar2 = lj_strscan_num((GCstr *)(rb->it64 & 0x7fffffffffff),pTVar5);
      if (iVar2 != 0) goto LAB_00118c09;
    }
    pTVar5 = (TValue *)0x0;
  }
LAB_00118c09:
  mm = (MMS)(uVar1 >> 0xb);
  if (pTVar5 == (TValue *)0x0) goto LAB_00118c6b;
  uVar3 = rc->it64 >> 0x2f;
  o = rc;
  if (0xfffffffffffffff1 < uVar3) {
    if (uVar3 == 0xfffffffffffffffb) {
      o = &local_38;
      iVar2 = lj_strscan_num((GCstr *)(rc->it64 & 0x7fffffffffff),o);
      if (iVar2 != 0) goto LAB_00118c42;
    }
    o = (TValue *)0x0;
  }
LAB_00118c42:
  if (o != (TValue *)0x0) {
    dVar6 = lj_vm_foldarith(pTVar5->n,o->n,mm - MM_add);
    ra->n = dVar6;
    return (TValue *)0x0;
  }
LAB_00118c6b:
  pcVar4 = lj_meta_lookup(L,rb,mm);
  if ((pcVar4->u64 == 0xffffffffffffffff) &&
     (pcVar4 = lj_meta_lookup(L,rc,mm), pcVar4->u64 == 0xffffffffffffffff)) {
    pcVar4 = str2num(rb,&local_40);
    if (pcVar4 == (cTValue *)0x0) {
      rc = rb;
    }
    lj_err_optype(L,rc,LJ_ERR_OPARITH);
  }
  uVar3 = L->base[-2].u64 & 0x7fffffffffff;
  if (*(char *)(uVar3 + 10) == '\0') {
    pTVar5 = L->base + *(byte *)(*(long *)(uVar3 + 0x20) + -0x5d);
  }
  else {
    pTVar5 = L->top;
  }
  pTVar5->n = (lua_Number)lj_cont_ra;
  pTVar5[1].u64 = 0xffffffffffffffff;
  pTVar5[2] = *pcVar4;
  pTVar5[3].u64 = 0xffffffffffffffff;
  pTVar5[4] = *rb;
  pTVar5[5] = *rc;
  return pTVar5 + 4;
}

Assistant:

TValue *lj_meta_arith(lua_State *L, TValue *ra, cTValue *rb, cTValue *rc,
		      BCReg op)
{
  MMS mm = bcmode_mm(op);
  TValue tempb, tempc;
  cTValue *b, *c;
  if ((b = str2num(rb, &tempb)) != NULL &&
      (c = str2num(rc, &tempc)) != NULL) {  /* Try coercion first. */
    setnumV(ra, lj_vm_foldarith(numV(b), numV(c), (int)mm-MM_add));
    return NULL;
  } else {
    cTValue *mo = lj_meta_lookup(L, rb, mm);
    if (tvisnil(mo)) {
      mo = lj_meta_lookup(L, rc, mm);
      if (tvisnil(mo)) {
	if (str2num(rb, &tempb) == NULL) rc = rb;
	lj_err_optype(L, rc, LJ_ERR_OPARITH);
	return NULL;  /* unreachable */
      }
    }
    return mmcall(L, lj_cont_ra, mo, rb, rc);
  }
}